

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dblk_compr.c
# Opt level: O2

void GenerateReverseLUT_16(UINT32 dstLen,UINT16 *dstLUT,UINT32 srcLen,UINT16 *srcLUT)

{
  ushort uVar1;
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  
  memset(dstLUT,0,(ulong)(dstLen * 2));
  for (uVar6 = 0; srcLen != uVar6; uVar6 = uVar6 + 1) {
    if (srcLUT[uVar6] < dstLen) {
      dstLUT[srcLUT[uVar6]] = (UINT16)uVar6;
    }
  }
  for (uVar6 = 0; uVar6 != dstLen; uVar6 = uVar6 + 1) {
    if ((dstLUT[uVar6] == 0) && (uVar6 != *srcLUT)) {
      uVar3 = 0xffff;
      uVar4 = 0;
      for (uVar2 = 0; srcLen != uVar2; uVar2 = uVar2 + 1) {
        uVar1 = srcLUT[uVar2];
        uVar5 = (uint)uVar1 - (int)uVar6;
        if (uVar1 < uVar6) {
          uVar5 = (int)uVar6 - (uint)uVar1;
        }
        if ((uVar5 < uVar3) || ((uVar6 < uVar1 && (uVar3 == uVar5)))) {
          uVar4 = uVar2 & 0xffffffff;
          uVar3 = uVar5;
        }
      }
      dstLUT[uVar6] = (UINT16)uVar4;
    }
  }
  return;
}

Assistant:

void GenerateReverseLUT_16(UINT32 dstLen, UINT16* dstLUT, UINT32 srcLen, const UINT16* srcLUT)
{
	UINT32 curSrc;
	UINT32 curDst;
	FUINT16 dist;
	UINT32 minIdx;
	FUINT16 minDist;
	
	memset(dstLUT, 0x00, dstLen * 0x02);
	for (curSrc = 0x00; curSrc < srcLen; curSrc ++)
	{
		if (srcLUT[curSrc] < dstLen)
			dstLUT[srcLUT[curSrc]] = (UINT16)curSrc;
	}
	
	for (curDst = 0x00; curDst < dstLen; curDst ++)
	{
		if (! dstLUT[curDst] && srcLUT[0] != curDst)
		{
			minDist = 0xFFFF;
			minIdx = 0x00;
			for (curSrc = 0x00; curSrc < srcLen; curSrc ++)
			{
				dist = (curDst > srcLUT[curSrc]) ? (curDst - srcLUT[curSrc]) : (srcLUT[curSrc] - curDst);
				// The second condition results in more algorithm-like rounding.
				if (minDist > dist || (minDist == dist && (curDst < srcLUT[curSrc])))
				{
					minDist = dist;
					minIdx = curSrc;
				}
			}
			dstLUT[curDst] = (UINT16)minIdx;
		}
	}
	
	return;
}